

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

void parse_reductions(options_i *options,vw *all)

{
  stack<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::deque<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>_>
  *this;
  iterator *piVar1;
  _Elt_pointer pp_Var2;
  base_learner *pbVar3;
  _func_learner<char,_char>_ptr_options_i_ptr_vw_ptr *local_28;
  
  this = &all->reduction_stack;
  local_28 = GD::setup;
  piVar1 = &(all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = GD::setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = kernel_svm_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = kernel_svm_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = ftrl_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = ftrl_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = svrg_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = svrg_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = sender_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = sender_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = gd_mf_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = gd_mf_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = print_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = print_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = noop_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = noop_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = lda_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = lda_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = bfgs_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = bfgs_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = OjaNewton_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = OjaNewton_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = baseline_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = baseline_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = ExpReplay::expreplay_setup<(char)98,simple_label>;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = ExpReplay::expreplay_setup<(char)98,simple_label>;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = active_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = active_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = active_cover_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = active_cover_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = confidence_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = confidence_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = nn_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = nn_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = mf_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = mf_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = marginal_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = marginal_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = autolink_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = autolink_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = lrq_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = lrq_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = lrqfa_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = lrqfa_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = stagewise_poly_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = stagewise_poly_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = scorer_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = scorer_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = bs_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = bs_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = binary_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = binary_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = ExpReplay::expreplay_setup<(char)109,MULTICLASS::mc_label>;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = ExpReplay::expreplay_setup<(char)109,MULTICLASS::mc_label>;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = topk_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = topk_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = oaa_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = oaa_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = boosting_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = boosting_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = ect_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = ect_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = log_multi_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = log_multi_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = recall_tree_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = recall_tree_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = memory_tree_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = memory_tree_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = classweight_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = classweight_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = multilabel_oaa_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = multilabel_oaa_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = cs_active_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = cs_active_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = CSOAA::csoaa_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = CSOAA::csoaa_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = interact_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = interact_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = CSOAA::csldf_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = CSOAA::csldf_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = cb_algs_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = cb_algs_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = cb_adf_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = cb_adf_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = mwt_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = mwt_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = cb_explore_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = cb_explore_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = cb_explore_adf_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = cb_explore_adf_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = VW::shared_feature_merger::shared_feature_merger_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = VW::shared_feature_merger::shared_feature_merger_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = warm_cb_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = warm_cb_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = cbify_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = cbify_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = cbifyldf_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = cbifyldf_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = explore_eval_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = explore_eval_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = ExpReplay::expreplay_setup<(char)99,COST_SENSITIVE::cs_label>;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = ExpReplay::expreplay_setup<(char)99,COST_SENSITIVE::cs_label>;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = Search::setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = Search::setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_28 = audit_regressor_setup;
  pp_Var2 = (all->reduction_stack).c.
            super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (all->reduction_stack).c.
      super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
    ::_M_push_back_aux<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
              ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
                *)this,&local_28);
  }
  else {
    *pp_Var2 = audit_regressor_setup;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  pbVar3 = setup_base(options,all);
  all->l = pbVar3;
  return;
}

Assistant:

void parse_reductions(options_i& options, vw& all)
{
  // Base algorithms
  all.reduction_stack.push(GD::setup);
  all.reduction_stack.push(kernel_svm_setup);
  all.reduction_stack.push(ftrl_setup);
  all.reduction_stack.push(svrg_setup);
  all.reduction_stack.push(sender_setup);
  all.reduction_stack.push(gd_mf_setup);
  all.reduction_stack.push(print_setup);
  all.reduction_stack.push(noop_setup);
  all.reduction_stack.push(lda_setup);
  all.reduction_stack.push(bfgs_setup);
  all.reduction_stack.push(OjaNewton_setup);
  // all.reduction_stack.push(VW_CNTK::setup);

  // Score Users
  all.reduction_stack.push(baseline_setup);
  all.reduction_stack.push(ExpReplay::expreplay_setup<'b', simple_label>);
  all.reduction_stack.push(active_setup);
  all.reduction_stack.push(active_cover_setup);
  all.reduction_stack.push(confidence_setup);
  all.reduction_stack.push(nn_setup);
  all.reduction_stack.push(mf_setup);
  all.reduction_stack.push(marginal_setup);
  all.reduction_stack.push(autolink_setup);
  all.reduction_stack.push(lrq_setup);
  all.reduction_stack.push(lrqfa_setup);
  all.reduction_stack.push(stagewise_poly_setup);
  all.reduction_stack.push(scorer_setup);
  // Reductions
  all.reduction_stack.push(bs_setup);
  all.reduction_stack.push(binary_setup);

  all.reduction_stack.push(ExpReplay::expreplay_setup<'m', MULTICLASS::mc_label>);
  all.reduction_stack.push(topk_setup);
  all.reduction_stack.push(oaa_setup);
  all.reduction_stack.push(boosting_setup);
  all.reduction_stack.push(ect_setup);
  all.reduction_stack.push(log_multi_setup);
  all.reduction_stack.push(recall_tree_setup);
  all.reduction_stack.push(memory_tree_setup);
  all.reduction_stack.push(classweight_setup);
  all.reduction_stack.push(multilabel_oaa_setup);

  all.reduction_stack.push(cs_active_setup);
  all.reduction_stack.push(CSOAA::csoaa_setup);
  all.reduction_stack.push(interact_setup);
  all.reduction_stack.push(CSOAA::csldf_setup);
  all.reduction_stack.push(cb_algs_setup);
  all.reduction_stack.push(cb_adf_setup);
  all.reduction_stack.push(mwt_setup);
  all.reduction_stack.push(cb_explore_setup);
  all.reduction_stack.push(cb_explore_adf_setup);
  all.reduction_stack.push(VW::shared_feature_merger::shared_feature_merger_setup);
  // cbify/warm_cb can generate multi-examples. Merge shared features after them
  all.reduction_stack.push(warm_cb_setup);
  all.reduction_stack.push(cbify_setup);
  all.reduction_stack.push(cbifyldf_setup);
  all.reduction_stack.push(explore_eval_setup);
  all.reduction_stack.push(ExpReplay::expreplay_setup<'c', COST_SENSITIVE::cs_label>);
  all.reduction_stack.push(Search::setup);
  all.reduction_stack.push(audit_regressor_setup);

  all.l = setup_base(options, all);
}